

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void server::_doflagrun(clientinfo *ci,int timeused)

{
  bool bVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  _flagrun *p_Var7;
  stringformatter local_148;
  stringformatter local_140;
  char local_138 [8];
  string msg;
  int lastfr;
  bool isbest;
  _flagrun *p_Stack_20;
  int i;
  _flagrun *fr;
  int timeused_local;
  clientinfo *ci_local;
  
  if (timeused < 0x1f5) {
    pcVar6 = colorname(ci);
    out(3,"\f0%s \f7scored a \f6MEGARUN!",pcVar6);
  }
  else if (serverflagruns != 0) {
    p_Stack_20 = (_flagrun *)0x0;
    for (lastfr = 0; iVar5 = vector<server::_flagrun>::length((vector<server::_flagrun> *)_flagruns)
        , lastfr < iVar5; lastfr = lastfr + 1) {
      p_Var7 = vector<server::_flagrun>::operator[]((vector<server::_flagrun> *)_flagruns,lastfr);
      if (p_Var7->gamemode == gamemode) {
        p_Var7 = vector<server::_flagrun>::operator[]((vector<server::_flagrun> *)_flagruns,lastfr);
        iVar5 = strcmp(p_Var7->map,&smapname);
        if (iVar5 == 0) {
          p_Stack_20 = vector<server::_flagrun>::operator[]
                                 ((vector<server::_flagrun> *)_flagruns,lastfr);
          break;
        }
      }
    }
    bVar3 = false;
    if (p_Stack_20 == (_flagrun *)0x0) {
      bVar3 = true;
      iVar5 = vector<server::_flagrun>::length((vector<server::_flagrun> *)_flagruns);
      if (0x3ff < iVar5) {
        return;
      }
      vector<server::_flagrun>::add((vector<server::_flagrun> *)_flagruns);
      pcVar6 = newstring(&smapname);
      p_Var7 = vector<server::_flagrun>::operator[]((vector<server::_flagrun> *)_flagruns,iVar5);
      p_Var7->map = pcVar6;
      iVar4 = gamemode;
      p_Var7 = vector<server::_flagrun>::operator[]((vector<server::_flagrun> *)_flagruns,iVar5);
      p_Var7->gamemode = iVar4;
      pcVar6 = newstring(ci->name);
      p_Var7 = vector<server::_flagrun>::operator[]((vector<server::_flagrun> *)_flagruns,iVar5);
      p_Var7->name = pcVar6;
      p_Var7 = vector<server::_flagrun>::operator[]((vector<server::_flagrun> *)_flagruns,iVar5);
      p_Var7->timeused = timeused;
      p_Stack_20 = vector<server::_flagrun>::operator[]((vector<server::_flagrun> *)_flagruns,iVar5)
      ;
    }
    bVar1 = true;
    if (!bVar3) {
      bVar1 = timeused <= p_Stack_20->timeused;
    }
    if (bVar1) {
      _newflagrun = 1;
      iVar5 = strcmp(ci->name,p_Stack_20->name);
      if (iVar5 != 0) {
        if (p_Stack_20->name != (char *)0x0) {
          if (p_Stack_20->name != (char *)0x0) {
            operator_delete__(p_Stack_20->name);
          }
          p_Stack_20->name = (char *)0x0;
        }
        pcVar6 = newstring(ci->name);
        p_Stack_20->name = pcVar6;
      }
      p_Stack_20->timeused = timeused;
    }
    if (bVar1) {
      stringformatter::stringformatter(&local_140,local_138);
      pcVar6 = colorname(ci);
      stringformatter::operator()
                (&local_140,"\f0%s \f7scored a flagrun in \f7%i.%02i \f7seconds (\f2best\f7)",pcVar6
                 ,(long)timeused / 1000 & 0xffffffff,
                 (long)((ulong)(uint)((int)((long)timeused % 1000) >> 0x1f) << 0x20 |
                       (long)timeused % 1000 & 0xffffffffU) / 10 & 0xffffffff);
    }
    else {
      stringformatter::stringformatter(&local_148,local_138);
      pcVar6 = colorname(ci);
      uVar2 = (long)p_Stack_20->timeused % 1000;
      stringformatter::operator()
                (&local_148,
                 "\f0%s \f7scored a flagrun in \f7%i.%02i \f7seconds (\f2best: \f0%s \f7%i.%02i\f7)"
                 ,pcVar6,(long)timeused / 1000 & 0xffffffff,
                 (long)((ulong)(uint)((int)((long)timeused % 1000) >> 0x1f) << 0x20 |
                       (long)timeused % 1000 & 0xffffffffU) / 10 & 0xffffffff,p_Stack_20->name,
                 p_Stack_20->timeused / 1000,
                 (int)((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) / 10))
      ;
    }
    sendservmsg(local_138);
  }
  return;
}

Assistant:

void _doflagrun(clientinfo *ci, int timeused)
    {
        if(timeused <= 500)
        {
            out(ECHO_SERV, "\f0%s \f7scored a \f6MEGARUN!", colorname(ci));
            return;
        }
        if(serverflagruns)
        {
            _flagrun *fr = 0;
            loopv(_flagruns) if(_flagruns[i].gamemode == gamemode && !strcmp(_flagruns[i].map, smapname))
            { fr = &_flagruns[i]; break; }
            bool isbest = false;
            if(!fr)
            {
                isbest = true;
                int lastfr = _flagruns.length();
                if(lastfr >= 1024) return;
                _flagruns.add();
                _flagruns[lastfr].map = newstring(smapname);
                _flagruns[lastfr].gamemode = gamemode;
                _flagruns[lastfr].name = newstring(ci->name);
                _flagruns[lastfr].timeused = timeused;
                fr = &_flagruns[lastfr];
            }
            isbest = isbest || timeused <= fr->timeused;
            if(isbest)
            {
                _newflagrun = 1;
                if(strcmp(ci->name, fr->name))
                {
                    DELETEA(fr->name);
                    fr->name = newstring(ci->name);
                }
                fr->timeused = timeused;
            }
            string msg;
            if(isbest) formatstring(msg)("\f0%s \f7scored a flagrun in \f7%i.%02i \f7seconds (\f2best\f7)",
                                         colorname(ci), timeused/1000, (timeused%1000)/10);
            else formatstring(msg)("\f0%s \f7scored a flagrun in \f7%i.%02i \f7seconds (\f2best: \f0%s \f7%i.%02i\f7)",
                                   colorname(ci), timeused/1000, (timeused%1000)/10, fr->name, fr->timeused/1000, (fr->timeused%1000)/10);
            sendservmsg(msg);
        }
    }